

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O1

void __thiscall QUndoStack::setIndex(QUndoStack *this,int idx)

{
  long i;
  QUndoStackPrivate *this_00;
  ulong uVar1;
  QUndoCommand *pQVar2;
  long lVar3;
  int iVar4;
  int idx_00;
  ulong uVar5;
  
  this_00 = *(QUndoStackPrivate **)&this->field_0x8;
  if ((this_00->macro_stack).d.size != 0) {
    setIndex();
    return;
  }
  if (idx < 0) {
    uVar5 = 0;
  }
  else {
    uVar1 = (this_00->command_list).d.size;
    uVar5 = uVar1 & 0xffffffff;
    if ((uint)idx <= uVar1) {
      uVar5 = (ulong)(uint)idx;
    }
  }
  iVar4 = this_00->index;
  idx_00 = (int)uVar5;
  if (iVar4 < idx_00) {
    do {
      pQVar2 = (this_00->command_list).d.ptr[iVar4];
      if (pQVar2->d->obsolete == false) {
        (*pQVar2->_vptr_QUndoCommand[3])(pQVar2);
      }
      if (pQVar2->d->obsolete == true) {
        pQVar2 = QList<QUndoCommand_*>::takeAt(&this_00->command_list,(long)iVar4);
        if (pQVar2 != (QUndoCommand *)0x0) {
          (*pQVar2->_vptr_QUndoCommand[1])(pQVar2);
        }
        if (iVar4 < this_00->clean_index) {
          resetClean(this);
        }
        uVar5 = (ulong)((int)uVar5 - 1);
      }
      else {
        iVar4 = iVar4 + 1;
      }
      idx_00 = (int)uVar5;
    } while (iVar4 < idx_00);
  }
  if (idx_00 < iVar4) {
    lVar3 = (long)iVar4;
    do {
      i = lVar3 + -1;
      pQVar2 = (this_00->command_list).d.ptr[lVar3 + -1];
      (*pQVar2->_vptr_QUndoCommand[2])(pQVar2);
      if (pQVar2->d->obsolete == true) {
        pQVar2 = QList<QUndoCommand_*>::takeAt(&this_00->command_list,i);
        if (pQVar2 != (QUndoCommand *)0x0) {
          (*pQVar2->_vptr_QUndoCommand[1])(pQVar2);
        }
        if (lVar3 <= this_00->clean_index) {
          resetClean(this);
        }
      }
      lVar3 = i;
    } while (idx_00 < i);
  }
  QUndoStackPrivate::setIndex(this_00,idx_00,false);
  return;
}

Assistant:

void QUndoStack::setIndex(int idx)
{
    Q_D(QUndoStack);
    if (Q_UNLIKELY(!d->macro_stack.isEmpty())) {
        qWarning("QUndoStack::setIndex(): cannot set index in the middle of a macro");
        return;
    }

    if (idx < 0)
        idx = 0;
    else if (idx > d->command_list.size())
        idx = d->command_list.size();

    int i = d->index;
    while (i < idx) {
        QUndoCommand *cmd = d->command_list.at(i);

        if (!cmd->isObsolete())
            cmd->redo();  // A separate check is done b/c the undo command may set obsolete flag

        if (cmd->isObsolete()) {
            delete d->command_list.takeAt(i);

            if (d->clean_index > i)
                resetClean();

            idx--; // Subtract from idx because we removed a command
        } else {
            i++;
        }
    }

    while (i > idx) {
        QUndoCommand *cmd = d->command_list.at(--i);

        cmd->undo();
        if (cmd->isObsolete()) {
            delete d->command_list.takeAt(i);

            if (d->clean_index > i)
                resetClean();
        }
    }

    d->setIndex(idx, false);
}